

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O3

bool __thiscall ON_PolyCurve::ChangeClosedCurveSeam(ON_PolyCurve *this,double t)

{
  double t0;
  bool bVar1;
  int iVar2;
  uint count;
  int iVar3;
  int iVar4;
  uint uVar5;
  ON_Curve *pOVar6;
  long lVar7;
  double dVar8;
  _func_int **extraout_XMM0_Qa;
  double *pdVar9;
  ON_Interval Segdom;
  ON_Interval sdom;
  ON_Interval old_dom;
  ON_Curve *sright;
  ON_Curve *sleft;
  double k;
  ON_Curve *local_a0;
  ON_SimpleArray<double> local_90;
  ON_SimpleArray<ON_Curve_*> local_78;
  ON_Interval local_60;
  ON_Curve *local_50;
  ON_Curve *local_48;
  double local_40;
  double local_38;
  
  iVar2 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x34])();
  if ((char)iVar2 == '\0') {
    return false;
  }
  (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x17])(this);
  iVar2 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count;
  (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])(this);
  if (iVar2 == 1) {
    if ((this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count < 1) {
      return false;
    }
    pOVar6 = *(this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a;
    if (pOVar6 == (ON_Curve *)0x0) {
      return false;
    }
    (*(pOVar6->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])(pOVar6);
    ON_Interval::TransformParameterTo(&local_60,(ON_Interval *)&local_78,t);
    iVar2 = (*(pOVar6->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x27])(pOVar6);
    if ((char)iVar2 != '\0') {
      dVar8 = ON_Interval::Length(&local_60);
      (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])
                (t,dVar8 + t,this);
      return (bool)(char)iVar2;
    }
    return false;
  }
  local_40 = t;
  bVar1 = ON_Interval::Includes(&local_60,t,false);
  dVar8 = t;
  if (!bVar1) {
    dVar8 = ON_Interval::NormalizedParameterAt(&local_60,t);
    dVar8 = fmod(dVar8,1.0);
    dVar8 = ON_Interval::ParameterAt
                      (&local_60,
                       (double)(~-(ulong)(dVar8 < 0.0) & (ulong)dVar8 |
                               (ulong)(dVar8 + 1.0) & -(ulong)(dVar8 < 0.0)));
    local_40 = dVar8;
  }
  bVar1 = ON_Interval::Includes(&local_60,dVar8,true);
  if (!bVar1) goto LAB_00585baf;
  count = ON_NurbsSpanIndex(2,iVar2 + 1,(this->m_t).m_a,dVar8,0,0);
  pdVar9 = (this->m_t).m_a;
  t0 = pdVar9[(int)count];
  if (dVar8 < t0) {
    return false;
  }
  pdVar9 = (double *)pdVar9[(long)(int)count + 1];
  if ((double)pdVar9 <= dVar8) {
    return false;
  }
  pOVar6 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a[(int)count];
  local_48 = (ON_Curve *)0x0;
  local_50 = (ON_Curve *)0x0;
  if ((dVar8 != t0) || (NAN(dVar8) || NAN(t0))) {
    ON_Interval::ON_Interval((ON_Interval *)&local_78,t0,(double)pdVar9);
    local_38 = ON_Interval::NormalizedParameterAt((ON_Interval *)&local_78,dVar8);
    (*(pOVar6->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])(pOVar6);
    local_90._vptr_ON_SimpleArray = extraout_XMM0_Qa;
    local_90.m_a = pdVar9;
    ON_Interval::ParameterAt((ON_Interval *)&local_90,local_38);
    iVar3 = (*(pOVar6->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x3e])
                      (pOVar6,&local_48,&local_50);
    iVar4 = iVar2 + 1;
    local_a0 = pOVar6;
    if ((char)iVar3 == '\0') {
      if (0.5 < local_38) {
        uVar5 = count + 1;
        if ((int)uVar5 < iVar2) {
          pOVar6 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a[(long)(int)count + 1];
          count = uVar5;
        }
        else {
          pOVar6 = (ON_Curve *)0x0;
          count = uVar5;
        }
      }
      goto LAB_005859bd;
    }
  }
  else {
LAB_005859bd:
    local_a0 = (ON_Curve *)0x0;
    iVar4 = iVar2;
    local_50 = pOVar6;
  }
  if (iVar2 <= (int)count) goto LAB_00585baf;
  (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a[(int)count] = (ON_Curve *)0x0;
  local_78._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0080bda0;
  local_78.m_a = (ON_Curve **)0x0;
  local_78.m_count = 0;
  local_78.m_capacity = 0;
  if (iVar4 == 0) {
    iVar4 = 1;
LAB_00585a4c:
    local_90.m_count = 0;
    local_90.m_capacity = 0;
    local_90.m_a = (double *)0x0;
    local_90._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0080a228;
    ON_SimpleArray<double>::SetCapacity(&local_90,(long)iVar4);
  }
  else {
    ON_SimpleArray<ON_Curve_*>::SetCapacity(&local_78,(long)iVar4);
    local_90._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0080a228;
    local_90.m_a = (double *)0x0;
    local_90.m_count = 0;
    local_90.m_capacity = 0;
    iVar4 = iVar4 + 1;
    if (iVar4 != 0) goto LAB_00585a4c;
  }
  ON_SimpleArray<ON_Curve_*>::Append(&local_78,&local_50);
  ON_SimpleArray<double>::Append(&local_90,&local_40);
  ON_SimpleArray<ON_Curve_*>::Append
            (&local_78,iVar2 + ~count,
             (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a + (long)(int)count + 1);
  ON_SimpleArray<double>::Append(&local_90,iVar2 + ~count,(this->m_t).m_a + (long)(int)count + 1);
  iVar2 = local_90.m_count;
  lVar7 = (long)local_90.m_count;
  ON_SimpleArray<ON_Curve_*>::Append
            (&local_78,count,(this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a);
  ON_SimpleArray<double>::Append(&local_90,count,(this->m_t).m_a);
  if (local_48 != (ON_Curve *)0x0) {
    ON_SimpleArray<ON_Curve_*>::Append(&local_78,&local_48);
    ON_SimpleArray<double>::Append(&local_90,(this->m_t).m_a + (int)count);
  }
  ON_SimpleArray<double>::Append(&local_90,&local_40);
  dVar8 = ON_Interval::Length(&local_60);
  if (iVar2 < local_90.m_count) {
    do {
      local_90.m_a[lVar7] = local_90.m_a[lVar7] + dVar8;
      lVar7 = lVar7 + 1;
    } while (local_90.m_count != lVar7);
  }
  memset((this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a,0,
         (long)(this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_capacity << 3);
  if (-1 < (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_capacity) {
    (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count = 0;
  }
  ON_SimpleArray<ON_Curve_*>::Append
            (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,local_78.m_count,local_78.m_a);
  ON_SimpleArray<double>::operator=(&this->m_t,&local_90);
  if (local_a0 != (ON_Curve *)0x0) {
    (*(local_a0->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])(local_a0);
  }
  ON_SimpleArray<double>::~ON_SimpleArray(&local_90);
  ON_SimpleArray<ON_Curve_*>::~ON_SimpleArray(&local_78);
LAB_00585baf:
  dVar8 = ON_Interval::Length(&local_60);
  (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])
            (t,dVar8 + t,this);
  return true;
}

Assistant:

bool ON_PolyCurve::ChangeClosedCurveSeam( double t )
{
  bool rc = IsClosed();
  if ( rc )
  {
  	DestroyRuntimeCache();
    rc = false;
    const int old_count = Count();
    const ON_Interval old_dom = Domain();
    ON_Curve* scrv = 0;
    if ( old_count == 1 )
    {
      scrv = SegmentCurve(0);
      if ( scrv )
      {
        ON_Interval sdom = scrv->Domain();
        double s = old_dom.TransformParameterTo(sdom, t);
        rc = scrv->ChangeClosedCurveSeam(s);
        if ( rc )
          SetDomain( t, t + old_dom.Length() );
      }
    }
    else
    {
      double k = t;
      if ( !old_dom.Includes(t) )
      {
        double s = old_dom.NormalizedParameterAt(t);
        s = fmod(s,1.0);
        if ( s < 0.0 )
          s += 1.0;
        k = old_dom.ParameterAt(s);
      }
      if ( old_dom.Includes(k,true) )
      {
        int segment_index = ON_NurbsSpanIndex(2,old_count+1,m_t.Array(),k,0,0);
        scrv = m_segment[segment_index];
        if ( k < m_t[segment_index] )
          return false;
        if ( k >= m_t[segment_index+1] )
          return false;
        int new_count = (k==m_t[segment_index]) ? old_count : old_count+1;
        ON_Curve* sleft = 0;
        ON_Curve* sright = 0;
        if ( new_count > old_count )
        {
					ON_Interval subdom(m_t[segment_index], m_t[segment_index+1]);
					double nt = subdom.NormalizedParameterAt(k);
					ON_Interval Segdom = scrv->Domain();
					double segt = Segdom.ParameterAt(nt);
          rc = scrv->Split( segt, sleft, sright );

//				Greg Arden 6 May 2003. Fixes TRR#10332.  If split fails we break the
//				curve between segments and adjust the parameterization
					if(!rc){
						if(nt>.5){
							segment_index++;
							if(segment_index<old_count)
								scrv = m_segment[segment_index];		
							else
								scrv = nullptr;
						}
						new_count--;
					}
        }
        if(new_count==old_count)
        {
          sright = scrv;
          scrv = 0;
          rc = true;
        }
        if ( rc && segment_index<old_count)
        {
          m_segment[segment_index] = 0;//todo
          ON_SimpleArray<ON_Curve*> new_c(new_count);
          ON_SimpleArray<double> new_t(new_count+1);
          new_c.Append(sright);
          new_t.Append(k);
          new_c.Append( old_count-segment_index-1, m_segment.Array()+segment_index+1);
          new_t.Append( old_count-segment_index-1, m_t.Array()+segment_index+1);
          int j = new_t.Count();
          new_c.Append( segment_index, m_segment.Array() );
          new_t.Append( segment_index, m_t.Array() );
          if ( sleft )
          {
            new_c.Append(sleft);
            new_t.Append(m_t[segment_index]);
          }
          new_t.Append(k);
          double d = old_dom.Length();
          while (j < new_t.Count() )
          {
            new_t[j] += d;
            j++;
          }

          // take care when moving new_c pointers to m_segment
          // so that we don't delete any curves.
          memset( m_segment.Array(), 0, m_segment.Capacity()*sizeof( *m_segment.Array() ) );
          m_segment.SetCount(0);
          m_segment.Append( new_c.Count(), new_c.Array() );
          m_t = new_t;
          if ( scrv )
          {
            delete scrv;
            scrv = 0;
          }
        }
      }
      else
      {
        // k is already the start or  end of the existing curve
        rc = true;
      }
      if ( rc )
        SetDomain( t, t + old_dom.Length() );
    }
  }
  return rc;
}